

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O2

void __thiscall iqxmlrpc::http::Header::set_conn_keep_alive(Header *this,bool c)

{
  undefined7 in_register_00000031;
  char *__s;
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"connection",&local_51);
  __s = "close";
  if ((int)CONCAT71(in_register_00000031,c) != 0) {
    __s = "keep-alive";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_52);
  set_option(this,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Header::set_conn_keep_alive(bool c)
{
  set_option(names::connection, c ? "keep-alive" : "close");
}